

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O0

Reg __thiscall
backend::codegen::RegAllocator::alloc_transient_reg
          (RegAllocator *this,Interval i,optional<unsigned_int> orig)

{
  bool bVar1;
  __optional_eq_t<unsigned_int,_unsigned_int> _Var2;
  pointer ppVar3;
  void *this_00;
  reference ppVar4;
  size_type sVar5;
  ostream *poVar6;
  reference ppVar7;
  runtime_error *this_01;
  reference pvVar8;
  mapped_type *pmVar9;
  uint *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  Function *pFVar10;
  Interval in_RSI;
  long in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>,_bool>
  pVar11;
  iterator it_1;
  ostream *trace;
  int spill_pos;
  mapped_type interval;
  type_conflict1 *spill_phys;
  type_conflict1 *spill_virt;
  type *v;
  type *k;
  iterator __end4;
  iterator __begin4;
  unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
  *__range4;
  stringstream ss;
  iterator upper_bound;
  iterator lower_bound;
  anon_class_16_2_d7082aa3 alloc_using_glob;
  anon_class_16_2_d7082aa3 alloc_using_temp;
  pair<unsigned_int,_unsigned_int> x;
  uint r_1;
  iterator it;
  Reg r;
  undefined1 in_stack_fffffffffffff468;
  MemoryAccessKind in_stack_fffffffffffff469;
  int16_t in_stack_fffffffffffff46a;
  Reg in_stack_fffffffffffff46c;
  Function *in_stack_fffffffffffff470;
  const_iterator in_stack_fffffffffffff478;
  Function *in_stack_fffffffffffff480;
  Function *in_stack_fffffffffffff498;
  RegAllocator *in_stack_fffffffffffff4a0;
  char *in_stack_fffffffffffff4a8;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4b0;
  anon_class_16_2_d7082aa3 *in_stack_fffffffffffff4d0;
  MemoryOperand *in_stack_fffffffffffff4d8;
  uint *in_stack_fffffffffffff4e0;
  OpCode *in_stack_fffffffffffff4e8;
  Timestamp *in_stack_fffffffffffff4f8;
  ostream *in_stack_fffffffffffff500;
  Severity *in_stack_fffffffffffff568;
  ostream *in_stack_fffffffffffff570;
  RegAllocator *in_stack_fffffffffffff600;
  allocator<char> local_959;
  string local_958 [39];
  allocator<char> local_931;
  string local_930 [120];
  time_point_sys_clock local_8b8;
  Timestamp local_8b0;
  char local_898 [55];
  undefined1 local_861;
  pair<unsigned_int,_unsigned_int> local_860;
  _Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false> local_858;
  undefined1 local_850;
  pair<const_unsigned_int,_backend::codegen::Interval> local_844;
  _List_node_base *local_838;
  _List_node_base *local_830;
  _List_const_iterator<std::pair<unsigned_int,_unsigned_int>_> local_828;
  _Self local_820;
  _Self local_818;
  _Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false> local_810;
  undefined1 local_808;
  pair<const_unsigned_int,_backend::codegen::Interval> local_800;
  allocator<char> local_7f1;
  string local_7f0 [39];
  allocator<char> local_7c9;
  string local_7c8 [120];
  time_point_sys_clock local_750;
  Timestamp local_748;
  ostream local_730 [55];
  undefined1 local_6f9;
  ostream *local_6f8;
  undefined4 local_6bc;
  int local_6a4;
  Interval local_6a0;
  type_conflict1 *local_698;
  type_conflict1 *local_690;
  value_type local_688;
  undefined1 local_679;
  string local_678 [32];
  type *local_658;
  type *local_650;
  undefined8 local_648;
  uint local_640;
  _Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false> local_638;
  _Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false> local_630;
  long local_628;
  stringstream local_620 [16];
  ostream local_610 [380];
  uint local_494;
  _Self local_490;
  uint local_484;
  _Self local_480;
  uint *local_478;
  uint *local_468;
  _List_node_base *local_458;
  _List_const_iterator<std::pair<unsigned_int,_unsigned_int>_> local_450;
  pair<unsigned_int,_unsigned_int> local_448;
  Reg local_440;
  allocator<char> local_439;
  string local_438 [39];
  allocator<char> local_411;
  string local_410 [120];
  time_point_sys_clock local_398;
  Timestamp local_390 [3];
  undefined1 local_341;
  _Self local_340;
  _List_node_base *local_338;
  _Self local_330;
  _Self local_328;
  allocator<char> local_319;
  string local_318 [39];
  allocator<char> local_2f1;
  string local_2f0 [120];
  time_point_sys_clock local_278;
  Timestamp local_270 [3];
  undefined1 local_222;
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [120];
  time_point_sys_clock local_180;
  Timestamp local_178 [3];
  undefined1 local_12a;
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [120];
  time_point_sys_clock local_88;
  Timestamp local_80 [3];
  undefined1 local_25;
  uint local_24 [6];
  Interval local_c;
  
  local_24[0] = 0xffffffff;
  local_c = in_RSI;
  bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x23ce87);
  if (bVar1) {
    local_25 = 0;
    AixLog::operator<<(in_stack_fffffffffffff570,in_stack_fffffffffffff568);
    AixLog::Tag::Tag((Tag *)0x23cec9);
    AixLog::operator<<((ostream *)in_stack_fffffffffffff4a0,(Tag *)in_stack_fffffffffffff498);
    local_88.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_80,&local_88);
    AixLog::operator<<(in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
               (allocator<char> *)in_stack_fffffffffffff4a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
               (allocator<char> *)in_stack_fffffffffffff4a0);
    AixLog::Function::Function
              (in_stack_fffffffffffff480,(string *)in_stack_fffffffffffff478._M_node,
               (string *)in_stack_fffffffffffff470,
               CONCAT44(in_stack_fffffffffffff46c,
                        CONCAT22(in_stack_fffffffffffff46a,
                                 CONCAT11(in_stack_fffffffffffff469,in_stack_fffffffffffff468))));
    poVar6 = AixLog::operator<<((ostream *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
    std::operator<<(poVar6,"orig ");
    AixLog::Function::~Function(in_stack_fffffffffffff470);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator(&local_129);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator(&local_101);
    AixLog::Timestamp::~Timestamp(local_80);
    AixLog::Tag::~Tag((Tag *)0x23d045);
    local_12a = 0;
    AixLog::operator<<(in_stack_fffffffffffff570,in_stack_fffffffffffff568);
    AixLog::Tag::Tag((Tag *)0x23d07e);
    AixLog::operator<<((ostream *)in_stack_fffffffffffff4a0,(Tag *)in_stack_fffffffffffff498);
    local_180.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_178,&local_180);
    AixLog::operator<<(in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
               (allocator<char> *)in_stack_fffffffffffff4a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
               (allocator<char> *)in_stack_fffffffffffff4a0);
    AixLog::Function::Function
              (in_stack_fffffffffffff480,(string *)in_stack_fffffffffffff478._M_node,
               (string *)in_stack_fffffffffffff470,
               CONCAT44(in_stack_fffffffffffff46c,
                        CONCAT22(in_stack_fffffffffffff46a,
                                 CONCAT11(in_stack_fffffffffffff469,in_stack_fffffffffffff468))));
    AixLog::operator<<((ostream *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
    std::optional<unsigned_int>::value((optional<unsigned_int> *)in_stack_fffffffffffff470);
    arm::display_reg_name
              ((ostream *)in_stack_fffffffffffff4a0,(Reg)((ulong)in_stack_fffffffffffff498 >> 0x20))
    ;
    AixLog::Function::~Function(in_stack_fffffffffffff470);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator(&local_221);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    AixLog::Timestamp::~Timestamp(local_178);
    AixLog::Tag::~Tag((Tag *)0x23d214);
    local_222 = 0;
    AixLog::operator<<(in_stack_fffffffffffff570,in_stack_fffffffffffff568);
    AixLog::Tag::Tag((Tag *)0x23d24d);
    AixLog::operator<<((ostream *)in_stack_fffffffffffff4a0,(Tag *)in_stack_fffffffffffff498);
    local_278.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_270,&local_278);
    in_stack_fffffffffffff600 =
         (RegAllocator *)AixLog::operator<<(in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
               (allocator<char> *)in_stack_fffffffffffff4a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
               (allocator<char> *)in_stack_fffffffffffff4a0);
    AixLog::Function::Function
              (in_stack_fffffffffffff480,(string *)in_stack_fffffffffffff478._M_node,
               (string *)in_stack_fffffffffffff470,
               CONCAT44(in_stack_fffffffffffff46c,
                        CONCAT22(in_stack_fffffffffffff46a,
                                 CONCAT11(in_stack_fffffffffffff469,in_stack_fffffffffffff468))));
    poVar6 = AixLog::operator<<((ostream *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
    std::operator<<(poVar6," ");
    AixLog::Function::~Function(in_stack_fffffffffffff470);
    std::__cxx11::string::~string(local_318);
    std::allocator<char>::~allocator(&local_319);
    std::__cxx11::string::~string(local_2f0);
    std::allocator<char>::~allocator(&local_2f1);
    AixLog::Timestamp::~Timestamp(local_270);
    AixLog::Tag::~Tag((Tag *)0x23d3c9);
    local_328._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
         ::begin((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  *)CONCAT44(in_stack_fffffffffffff46c,
                             CONCAT22(in_stack_fffffffffffff46a,
                                      CONCAT11(in_stack_fffffffffffff469,in_stack_fffffffffffff468))
                            ));
    while( true ) {
      local_330._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::end((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  *)CONCAT44(in_stack_fffffffffffff46c,
                             CONCAT22(in_stack_fffffffffffff46a,
                                      CONCAT11(in_stack_fffffffffffff469,in_stack_fffffffffffff468))
                            ));
      bVar1 = std::operator!=(&local_328,&local_330);
      if (!bVar1) break;
      std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator->
                ((_List_iterator<std::pair<unsigned_int,_unsigned_int>_> *)0x23d42c);
      _Var2 = std::operator==((uint *)in_stack_fffffffffffff470,
                              (optional<unsigned_int> *)
                              CONCAT44(in_stack_fffffffffffff46c,
                                       CONCAT22(in_stack_fffffffffffff46a,
                                                CONCAT11(in_stack_fffffffffffff469,
                                                         in_stack_fffffffffffff468))));
      if (_Var2) break;
      local_338 = (_List_node_base *)
                  std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator++
                            (&local_328,0);
    }
    local_340._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
         ::end((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                *)CONCAT44(in_stack_fffffffffffff46c,
                           CONCAT22(in_stack_fffffffffffff46a,
                                    CONCAT11(in_stack_fffffffffffff469,in_stack_fffffffffffff468))))
    ;
    bVar1 = std::operator!=(&local_328,&local_340);
    if (bVar1) {
      local_341 = 0;
      AixLog::operator<<(in_stack_fffffffffffff570,in_stack_fffffffffffff568);
      AixLog::Tag::Tag((Tag *)0x23d791);
      AixLog::operator<<((ostream *)in_stack_fffffffffffff4a0,(Tag *)in_stack_fffffffffffff498);
      local_398.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      AixLog::Timestamp::Timestamp(local_390,&local_398);
      AixLog::operator<<(in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
                 (allocator<char> *)in_stack_fffffffffffff4a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
                 (allocator<char> *)in_stack_fffffffffffff4a0);
      AixLog::Function::Function
                (in_stack_fffffffffffff480,(string *)in_stack_fffffffffffff478._M_node,
                 (string *)in_stack_fffffffffffff470,
                 CONCAT44(in_stack_fffffffffffff46c,
                          CONCAT22(in_stack_fffffffffffff46a,
                                   CONCAT11(in_stack_fffffffffffff469,in_stack_fffffffffffff468))));
      poVar6 = AixLog::operator<<((ostream *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
      poVar6 = std::operator<<(poVar6,"r-> ");
      ppVar3 = std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator->
                         ((_List_iterator<std::pair<unsigned_int,_unsigned_int>_> *)0x23d8c7);
      this_00 = (void *)std::ostream::operator<<(poVar6,ppVar3->second);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      AixLog::Function::~Function(in_stack_fffffffffffff470);
      std::__cxx11::string::~string(local_438);
      std::allocator<char>::~allocator(&local_439);
      std::__cxx11::string::~string(local_410);
      std::allocator<char>::~allocator(&local_411);
      AixLog::Timestamp::~Timestamp(local_390);
      AixLog::Tag::~Tag((Tag *)0x23d952);
      ppVar3 = std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator->
                         ((_List_iterator<std::pair<unsigned_int,_unsigned_int>_> *)0x23d95f);
      local_440 = ppVar3->second;
      ppVar4 = std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator*
                         ((_List_iterator<std::pair<unsigned_int,_unsigned_int>_> *)0x23d976);
      local_448 = *ppVar4;
      std::_List_const_iterator<std::pair<unsigned_int,_unsigned_int>_>::_List_const_iterator
                (&local_450,&local_328);
      local_458 = (_List_node_base *)
                  std::__cxx11::
                  list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ::erase((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                           *)in_stack_fffffffffffff470,in_stack_fffffffffffff478);
      std::__cxx11::
      list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::push_back((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)in_stack_fffffffffffff480,(value_type *)in_stack_fffffffffffff478._M_node);
      return local_440;
    }
  }
  local_468 = local_24;
  local_478 = local_24;
  local_484 = local_c.start;
  local_480._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::lower_bound
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                  in_stack_fffffffffffff478._M_node,(key_type *)in_stack_fffffffffffff470);
  local_494 = local_c.end;
  local_490._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::upper_bound
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                  in_stack_fffffffffffff478._M_node,(key_type *)in_stack_fffffffffffff470);
  bVar1 = std::operator!=(&local_480,&local_490);
  if (bVar1) {
    alloc_transient_reg::anon_class_16_2_d7082aa3::operator()(in_stack_fffffffffffff4d0);
    alloc_transient_reg::anon_class_16_2_d7082aa3::operator()
              ((anon_class_16_2_d7082aa3 *)in_stack_fffffffffffff4a0);
  }
  else {
    alloc_transient_reg::anon_class_16_2_d7082aa3::operator()
              ((anon_class_16_2_d7082aa3 *)in_stack_fffffffffffff4a0);
    alloc_transient_reg::anon_class_16_2_d7082aa3::operator()(in_stack_fffffffffffff4d0);
  }
  if (local_24[0] == 0xffffffff) {
    sVar5 = std::__cxx11::
            list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ::size((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    *)in_stack_fffffffffffff470);
    if (sVar5 == 0) {
      std::__cxx11::stringstream::stringstream(local_620);
      poVar6 = std::operator<<(local_610,"Failed to allocate: all active registers are temporary!");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<(poVar6,"Dump: ");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      local_628 = in_RDI + 0x188;
      local_630._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
           ::begin((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                    *)CONCAT44(in_stack_fffffffffffff46c,
                               CONCAT22(in_stack_fffffffffffff46a,
                                        CONCAT11(in_stack_fffffffffffff469,in_stack_fffffffffffff468
                                                ))));
      local_638._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
           ::end((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                  *)CONCAT44(in_stack_fffffffffffff46c,
                             CONCAT22(in_stack_fffffffffffff46a,
                                      CONCAT11(in_stack_fffffffffffff469,in_stack_fffffffffffff468))
                            ));
      while (bVar1 = std::__detail::operator!=(&local_630,&local_638), bVar1) {
        ppVar7 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>
                 ::operator*((_Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>
                              *)0x23dcde);
        local_640 = (ppVar7->second).end;
        local_648._0_4_ = ppVar7->first;
        local_648._4_4_ = (ppVar7->second).start;
        local_650 = std::get<0ul,unsigned_int_const,backend::codegen::Interval>
                              ((pair<const_unsigned_int,_backend::codegen::Interval> *)0x23dd08);
        local_658 = std::get<1ul,unsigned_int_const,backend::codegen::Interval>
                              ((pair<const_unsigned_int,_backend::codegen::Interval> *)0x23dd1d);
        arm::display_reg_name
                  ((ostream *)in_stack_fffffffffffff4a0,
                   (Reg)((ulong)in_stack_fffffffffffff498 >> 0x20));
        poVar6 = std::operator<<(local_610,": [");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_658->start);
        poVar6 = std::operator<<(poVar6,", ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_658->end);
        poVar6 = std::operator<<(poVar6,"]");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>::
        operator++((_Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>
                    *)in_stack_fffffffffffff470);
      }
      local_679 = 1;
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(this_01,local_678);
      local_679 = 0;
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar8 = std::__cxx11::
             list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ::front((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      *)in_stack_fffffffffffff470);
    local_688 = *pvVar8;
    local_690 = std::get<0ul,unsigned_int,unsigned_int>
                          ((pair<unsigned_int,_unsigned_int> *)0x23df2e);
    local_698 = std::get<1ul,unsigned_int,unsigned_int>
                          ((pair<unsigned_int,_unsigned_int> *)0x23df43);
    std::__cxx11::
    list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::pop_front((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *)in_stack_fffffffffffff470);
    pmVar9 = std::
             unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
             ::at((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                   *)in_stack_fffffffffffff470,
                  (key_type *)
                  CONCAT44(in_stack_fffffffffffff46c,
                           CONCAT22(in_stack_fffffffffffff46a,
                                    CONCAT11(in_stack_fffffffffffff469,in_stack_fffffffffffff468))))
    ;
    local_6a0.end = (*pmVar9).end;
    local_6a0.start = local_c.start;
    local_6a4 = get_or_alloc_spill_pos
                          (in_stack_fffffffffffff4a0,(Reg)((ulong)in_stack_fffffffffffff498 >> 0x20)
                          );
    local_6bc = 0x1c;
    arm::MemoryOperand::MemoryOperand
              ((MemoryOperand *)in_stack_fffffffffffff470,in_stack_fffffffffffff46c,
               in_stack_fffffffffffff46a,in_stack_fffffffffffff469);
    std::
    make_unique<arm::LoadStoreInst,arm::OpCode,unsigned_int&,arm::MemoryOperand,arm::ConditionCode&>
              (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,
               (ConditionCode *)in_stack_fffffffffffff4d0);
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::LoadStoreInst,std::default_delete<arm::LoadStoreInst>,void>
              ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffff480,
               (unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_> *)
               in_stack_fffffffffffff478._M_node);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)in_stack_fffffffffffff470,
                (value_type *)
                CONCAT44(in_stack_fffffffffffff46c,
                         CONCAT22(in_stack_fffffffffffff46a,
                                  CONCAT11(in_stack_fffffffffffff469,in_stack_fffffffffffff468))));
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
              ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffff480);
    std::unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_>::~unique_ptr
              ((unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_> *)
               in_stack_fffffffffffff470);
    local_6f9 = 0;
    in_stack_fffffffffffff4f8 =
         (Timestamp *)AixLog::operator<<(in_stack_fffffffffffff570,in_stack_fffffffffffff568);
    in_stack_fffffffffffff500 = local_730;
    AixLog::Tag::Tag((Tag *)0x23e0d0);
    AixLog::operator<<((ostream *)in_stack_fffffffffffff4a0,(Tag *)in_stack_fffffffffffff498);
    local_750.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(&local_748,&local_750);
    AixLog::operator<<(in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
               (allocator<char> *)in_stack_fffffffffffff4a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
               (allocator<char> *)in_stack_fffffffffffff4a0);
    AixLog::Function::Function
              (in_stack_fffffffffffff480,(string *)in_stack_fffffffffffff478._M_node,
               (string *)in_stack_fffffffffffff470,
               CONCAT44(in_stack_fffffffffffff46c,
                        CONCAT22(in_stack_fffffffffffff46a,
                                 CONCAT11(in_stack_fffffffffffff469,in_stack_fffffffffffff468))));
    poVar6 = AixLog::operator<<((ostream *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
    AixLog::Function::~Function(in_stack_fffffffffffff470);
    std::__cxx11::string::~string(local_7f0);
    std::allocator<char>::~allocator(&local_7f1);
    std::__cxx11::string::~string(local_7c8);
    std::allocator<char>::~allocator(&local_7c9);
    AixLog::Timestamp::~Timestamp(&local_748);
    AixLog::Tag::~Tag((Tag *)0x23e22d);
    local_6f8 = poVar6;
    std::operator<<(poVar6,"Spilling: ");
    arm::display_reg_name
              ((ostream *)in_stack_fffffffffffff4a0,(Reg)((ulong)in_stack_fffffffffffff498 >> 0x20))
    ;
    std::operator<<(local_6f8," -> ");
    arm::display_reg_name
              ((ostream *)in_stack_fffffffffffff4a0,(Reg)((ulong)in_stack_fffffffffffff498 >> 0x20))
    ;
    poVar6 = std::operator<<(local_6f8," -> ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_6a4);
    std::operator<<(poVar6," ");
    local_24[0] = *local_698;
    std::pair<const_unsigned_int,_backend::codegen::Interval>::
    pair<unsigned_int_&,_backend::codegen::Interval_&,_true>(&local_800,local_690,&local_6a0);
    pVar11 = std::
             unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
             ::insert((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                       *)in_stack_fffffffffffff480,(value_type *)in_stack_fffffffffffff478._M_node);
    local_810._M_cur =
         (__node_type *)
         pVar11.first.
         super__Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>
         ._M_cur;
    local_808 = pVar11.second;
    local_818._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
         ::begin((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  *)CONCAT44(in_stack_fffffffffffff46c,
                             CONCAT22(in_stack_fffffffffffff46a,
                                      CONCAT11(in_stack_fffffffffffff469,in_stack_fffffffffffff468))
                            ));
    while( true ) {
      local_820._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::end((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  *)CONCAT44(in_stack_fffffffffffff46c,
                             CONCAT22(in_stack_fffffffffffff46a,
                                      CONCAT11(in_stack_fffffffffffff469,in_stack_fffffffffffff468))
                            ));
      bVar1 = std::operator!=(&local_818,&local_820);
      if (!bVar1) break;
      std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator->
                ((_List_iterator<std::pair<unsigned_int,_unsigned_int>_> *)0x23e387);
      _Var2 = std::operator==((uint *)in_stack_fffffffffffff470,
                              (optional<unsigned_int> *)
                              CONCAT44(in_stack_fffffffffffff46c,
                                       CONCAT22(in_stack_fffffffffffff46a,
                                                CONCAT11(in_stack_fffffffffffff469,
                                                         in_stack_fffffffffffff468))));
      if (_Var2) {
        std::_List_const_iterator<std::pair<unsigned_int,_unsigned_int>_>::_List_const_iterator
                  (&local_828,&local_818);
        local_830 = (_List_node_base *)
                    std::__cxx11::
                    list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ::erase((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                             *)in_stack_fffffffffffff470,in_stack_fffffffffffff478);
        break;
      }
      local_838 = (_List_node_base *)
                  std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator++
                            (&local_818,0);
    }
    std::
    unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
    ::erase((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
             *)in_stack_fffffffffffff470,
            (key_type *)
            CONCAT44(in_stack_fffffffffffff46c,
                     CONCAT22(in_stack_fffffffffffff46a,
                              CONCAT11(in_stack_fffffffffffff469,in_stack_fffffffffffff468))));
  }
  std::pair<const_unsigned_int,_backend::codegen::Interval>::
  pair<unsigned_int_&,_backend::codegen::Interval_&,_true>(&local_844,local_24,&local_c);
  pVar11 = std::
           unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
           ::insert((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                     *)in_stack_fffffffffffff480,(value_type *)in_stack_fffffffffffff478._M_node);
  local_858._M_cur =
       (__node_type *)
       pVar11.first.
       super__Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>.
       _M_cur;
  local_850 = pVar11.second;
  bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x23e598);
  if (bVar1) {
    __x = std::optional<unsigned_int>::value((optional<unsigned_int> *)in_stack_fffffffffffff470);
    std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int_&,_true>
              (&local_860,__x,local_24);
    std::__cxx11::
    list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::push_back((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *)in_stack_fffffffffffff480,(value_type *)in_stack_fffffffffffff478._M_node);
  }
  local_861 = 0;
  poVar6 = AixLog::operator<<(in_stack_fffffffffffff570,in_stack_fffffffffffff568);
  __s = local_898;
  AixLog::Tag::Tag((Tag *)0x23e61b);
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            AixLog::operator<<(poVar6,(Tag *)in_stack_fffffffffffff498);
  local_8b8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  AixLog::Timestamp::Timestamp(&local_8b0,&local_8b8);
  pFVar10 = (Function *)AixLog::operator<<(in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,__s,(allocator<char> *)poVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,__s,(allocator<char> *)poVar6);
  AixLog::Function::Function
            (in_stack_fffffffffffff480,(string *)in_stack_fffffffffffff478._M_node,
             (string *)in_stack_fffffffffffff470,
             CONCAT44(in_stack_fffffffffffff46c,
                      CONCAT22(in_stack_fffffffffffff46a,
                               CONCAT11(in_stack_fffffffffffff469,in_stack_fffffffffffff468))));
  poVar6 = AixLog::operator<<(poVar6,pFVar10);
  poVar6 = std::operator<<(poVar6,"-> ");
  pFVar10 = (Function *)std::ostream::operator<<(poVar6,local_24[0]);
  std::ostream::operator<<(pFVar10,std::endl<char,std::char_traits<char>>);
  AixLog::Function::~Function(pFVar10);
  std::__cxx11::string::~string(local_958);
  std::allocator<char>::~allocator(&local_959);
  std::__cxx11::string::~string(local_930);
  std::allocator<char>::~allocator(&local_931);
  AixLog::Timestamp::~Timestamp(&local_8b0);
  AixLog::Tag::~Tag((Tag *)0x23e7a3);
  display_active_regs(in_stack_fffffffffffff600);
  return local_24[0];
}

Assistant:

Reg RegAllocator::alloc_transient_reg(Interval i, std::optional<Reg> orig) {
  Reg r = -1;
  if (orig) {
    LOG(TRACE) << "orig ";
    display_reg_name(LOG(TRACE), orig.value());
    LOG(TRACE) << " ";
    auto it = active_reg_map.begin();
    while (it != active_reg_map.end()) {
      if (it->first == orig)
        break;
      else
        it++;
    }
    if (it != active_reg_map.end()) {
      LOG(TRACE) << "r-> " << it->second << std::endl;
      auto r = it->second;
      auto x = *it;
      active_reg_map.erase(it);
      active_reg_map.push_back(x);
      return r;
    }
  }
  auto alloc_using_temp = [&]() {
    if (r == -1) {
      for (auto reg : TEMP_REGS) {
        if (active.find(reg) == active.end()) {
          r = reg;
          break;
        }
      }
    }
  };
  auto alloc_using_glob = [&]() {
    if (r == -1) {
      for (auto reg : GLOB_REGS) {
        if (active.find(reg) == active.end() &&
            used_regs.find(reg) == used_regs.end()) {
          r = reg;
          used_regs_temp.insert(reg);
          break;
        }
      }
    }
  };
  {
    auto lower_bound = bl_points.lower_bound(i.start);
    auto upper_bound = bl_points.upper_bound(i.end);
    if (lower_bound != upper_bound) {
      // Cross-BL virtual register
      alloc_using_glob();
      alloc_using_temp();
    } else {
      // non-cross-bl virtual register
      alloc_using_temp();
      alloc_using_glob();
    }
  }
  if (r == -1) {
    // Choose a value in active to spill.
    // NOTE: the current algorithm chooses the earliest-allocated register
    if (active_reg_map.size() == 0) {
      std::stringstream ss;
      ss << "Failed to allocate: all active registers are "
            "temporary!"
         << std::endl
         << "Dump: " << std::endl;

      for (auto [k, v] : active) {
        display_reg_name(ss, k);
        ss << ": [" << v.start << ", " << v.end << "]" << std::endl;
      }

      throw std::runtime_error(ss.str());
    }
    auto [spill_virt, spill_phys] = active_reg_map.front();
    active_reg_map.pop_front();
    auto interval = active.at(spill_phys);
    interval.start = i.start;
    int spill_pos = get_or_alloc_spill_pos(spill_virt);
    // TODO: move this into a separate function
    inst_sink.push_back(std::make_unique<LoadStoreInst>(
        OpCode::StR, spill_phys,
        MemoryOperand(REG_SP, spill_pos + stack_offset), cur_cond));

    auto &trace = LOG(TRACE);
    trace << "Spilling: ";
    display_reg_name(trace, spill_phys);
    trace << " -> ";
    display_reg_name(trace, spill_virt);
    trace << " -> " << spill_pos << " ";

    r = spill_phys;
    spilled_regs.insert({spill_virt, interval});
    {
      auto it = active_reg_map.begin();
      while (it != active_reg_map.end()) {
        if (it->first == orig) {
          active_reg_map.erase(it);
          break;
        } else
          it++;
      }
    }
    active.erase(spill_phys);
  }
  this->active.insert({r, i});
  if (orig) {
    this->active_reg_map.push_back({orig.value(), r});
  }
  LOG(TRACE) << "-> " << r << std::endl;
  display_active_regs();
  return r;
}